

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

float closest_point_ray_segment(vec3 p1,vec3 q1,vec3 p2,vec3 q2,float *s,float *t,vec3 *c1,vec3 *c2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  vec3 vVar8;
  vec3 v2;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_340;
  float local_338;
  float denom;
  float b;
  float c;
  float f;
  float e;
  float a;
  vec3 r;
  vec3 d2;
  vec3 d1;
  vec3 *c2_local;
  vec3 *c1_local;
  float *t_local;
  float *s_local;
  vec3 q2_local;
  vec3 p2_local;
  vec3 q1_local;
  vec3 p1_local;
  
  vVar7 = vec3_sub(q1,p1);
  vVar8 = vec3_sub(q2,p2);
  v2 = vec3_sub(p1,p2);
  fVar1 = vec3_dot(vVar7,vVar7);
  fVar2 = vec3_dot(vVar8,vVar8);
  fVar3 = vec3_dot(vVar8,v2);
  if ((1e-05 < fVar1) || (1e-05 < fVar2)) {
    if (1e-05 < fVar1) {
      fVar4 = vec3_dot(vVar7,v2);
      if (1e-05 < fVar2) {
        fVar5 = vec3_dot(vVar7,vVar8);
        fVar6 = fVar1 * fVar2 + -(fVar5 * fVar5);
        if ((fVar6 != 0.0) || (NAN(fVar6))) {
          *s = (fVar5 * fVar3 + -(fVar4 * fVar2)) / fVar6;
        }
        else {
          *s = 0.0;
        }
        *t = (fVar5 * *s + fVar3) / fVar2;
        if (0.0 < *t || *t == 0.0) {
          if (1.0 < *t) {
            *t = 1.0;
            *s = (fVar5 - fVar4) / fVar1;
          }
        }
        else {
          *t = 0.0;
          *s = -fVar4 / fVar1;
        }
      }
      else {
        *t = 0.0;
        *s = -fVar4 / fVar1;
      }
    }
    else {
      *s = 0.0;
      *t = fVar3 / fVar2;
      fVar1 = clamp(*t,0.0,1.0);
      *t = fVar1;
    }
    vVar7 = vec3_scale(vVar7,*s);
    vVar7 = vec3_add(p1,vVar7);
    local_338 = vVar7.z;
    local_340 = vVar7._0_8_;
    c1->z = local_338;
    c1->x = (float)(undefined4)local_340;
    c1->y = (float)local_340._4_4_;
    vVar7 = vec3_scale(vVar8,*t);
    vVar7 = vec3_add(p2,vVar7);
    local_3a8 = vVar7.z;
    local_3b0 = vVar7._0_8_;
    c2->z = local_3a8;
    c2->x = (float)(undefined4)local_3b0;
    c2->y = (float)local_3b0._4_4_;
    vVar7 = vec3_sub(*c1,*c2);
    vVar8 = vec3_sub(*c1,*c2);
    p1_local.y = vec3_dot(vVar7,vVar8);
  }
  else {
    *t = 0.0;
    *s = 0.0;
    c1->z = p1.z;
    c1->x = (float)(int)p1._0_8_;
    c1->y = (float)(int)((ulong)p1._0_8_ >> 0x20);
    c2->z = p2.z;
    c2->x = (float)(int)p2._0_8_;
    c2->y = (float)(int)((ulong)p2._0_8_ >> 0x20);
    vVar7 = vec3_sub(*c1,*c2);
    vVar8 = vec3_sub(*c1,*c2);
    p1_local.y = vec3_dot(vVar7,vVar8);
  }
  return p1_local.y;
}

Assistant:

float closest_point_ray_segment(vec3 p1, vec3 q1, vec3 p2, vec3 q2, float *s, float *t, vec3 *c1, vec3 *c2) {
    vec3 d1 = vec3_sub(q1, p1);
    vec3 d2 = vec3_sub(q2, p2);
    vec3 r = vec3_sub(p1, p2);
    float a = vec3_dot(d1, d1);
    float e = vec3_dot(d2, d2);
    float f = vec3_dot(d2, r);

    if (a <= EPSILON && e <= EPSILON) {
        *s = *t = 0.0f;
        *c1 = p1;
        *c2 = p2;
        return vec3_dot(vec3_sub(*c1, *c2), vec3_sub(*c1, *c2)); 
    }
    if (a <= EPSILON) {
        *s = 0.0f;
        *t = f / e;
        *t = clamp(*t, 0.0f, 1.0f);
    } else {
        float c = vec3_dot(d1, r);
        if (e <= EPSILON) {
            *t = 0.0f;
            *s = -c / a;
        } else {
            float b = vec3_dot(d1, d2);
            float denom = a*e - b*b;

            if (denom != 0.0f) {
                *s = (b*f - c*e) / denom;
            } else {
                *s = 0.0f;
            }
            *t = (b*(*s) + f) / e;

            if (*t < 0.0f) {
                *t = 0.0f;
                *s = -c / a;
            } else if (*t > 1.0f) {
                *t = 1.0f;
                *s = (b - c) / a;
            }
        }
    }

    *c1 = vec3_add(p1, vec3_scale(d1, *s));
    *c2 = vec3_add(p2, vec3_scale(d2, *t));
    return vec3_dot(vec3_sub(*c1, *c2), vec3_sub(*c1, *c2));
}